

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::DualMaps::ComputeRollup(DualMaps *this,Rollup *rollup)

{
  bool bVar1;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_RSI;
  unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *map;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  *__range2;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_stack_000002f8;
  anon_class_8_1_69fb5516 in_stack_00000300;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_stack_00000318;
  anon_class_8_1_69fb5516 in_stack_00000320;
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
  *in_stack_ffffffffffffff70;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
  *in_stack_ffffffffffffff80;
  RangeMap *in_stack_ffffffffffffffb0;
  DualMaps *in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
  local_20 [2];
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)
       std::
       vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  std::
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
    ::operator*(local_20);
    std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>::operator->
              ((unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)0x194bfe);
    RangeMap::Compress(in_stack_ffffffffffffffb0);
    std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>::operator->
              ((unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)0x194c10);
    RangeMap::Compress(in_stack_ffffffffffffffb0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
    ::operator++(local_20);
  }
  VmMaps(in_stack_ffffffffffffffb8);
  RangeMap::
  ComputeRollup<bloaty::DualMaps::ComputeRollup(bloaty::Rollup*)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_1_>
            (in_stack_00000318,in_stack_00000320);
  std::vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::~vector
            (in_stack_ffffffffffffff80);
  FileMaps(in_stack_ffffffffffffffb8);
  RangeMap::
  ComputeRollup<bloaty::DualMaps::ComputeRollup(bloaty::Rollup*)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_2_>
            (in_stack_000002f8,in_stack_00000300);
  std::vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::~vector
            (local_10);
  return;
}

Assistant:

void ComputeRollup(Rollup* rollup) {
    for (auto& map : maps_) {
      map->vm_map.Compress();
      map->file_map.Compress();
    }
    RangeMap::ComputeRollup(VmMaps(), [=](const std::vector<std::string>& keys,
                                          uint64_t addr, uint64_t end) {
      return rollup->AddSizes(keys, end - addr, true);
    });
    RangeMap::ComputeRollup(
        FileMaps(),
        [=](const std::vector<std::string>& keys, uint64_t addr, uint64_t end) {
          return rollup->AddSizes(keys, end - addr, false);
        });
  }